

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O2

void spell_asphyxiate(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int idam;
  
  idam = dice(level,5);
  if (ch->in_room->sector_type == 8) {
    send_to_char("You cannot cast this here.\n\r",ch);
    return;
  }
  act("$N gasps as you corrupt the air $E is breathing!",ch,(void *)0x0,vo,3);
  act("You gasp as $n corrupts the air you are breathing!",ch,(void *)0x0,vo,2);
  act("$N gasps as $n corrupts the air $E is breathing!",ch,(void *)0x0,vo,1);
  bVar1 = saves_spell(level,(CHAR_DATA *)vo,0x14);
  if (bVar1) {
    idam = idam / 2;
  }
  damage_new(ch,(CHAR_DATA *)vo,idam,sn,0x14,true,false,0,1,(char *)0x0);
  return;
}

Assistant:

void spell_asphyxiate(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	int dam = dice(level, 5);

	if (ch->in_room->sector_type && ch->in_room->sector_type == SECT_UNDERWATER)
	{
		send_to_char("You cannot cast this here.\n\r", ch);
		return;
	}

	act("$N gasps as you corrupt the air $E is breathing!", ch, 0, victim, TO_CHAR);
	act("You gasp as $n corrupts the air you are breathing!", ch, 0, victim, TO_VICT);
	act("$N gasps as $n corrupts the air $E is breathing!", ch, 0, victim, TO_NOTVICT);

	if (saves_spell(level, victim, DAM_INTERNAL))
		dam /= 2;

	damage_new(ch, victim, dam, sn, DAM_INTERNAL, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, nullptr);
}